

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::DetermineObjectiveCClassDefinitions
          (MessageGenerator *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *fwd_decls)

{
  pointer puVar1;
  pointer puVar2;
  Descriptor *pDVar3;
  FieldGenerator *pFVar4;
  Descriptor *in_RDX;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *extraout_RDX_01;
  long lVar5;
  long lVar6;
  unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
  *generator;
  pointer puVar7;
  pointer puVar8;
  string containing_class;
  string local_68;
  string local_48;
  
  if ((*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x4b) == '\0') &&
     (pDVar3 = this->descriptor_, 0 < *(int *)(pDVar3 + 4))) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      pFVar4 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar3 + 0x28) + lVar5));
      (*pFVar4->_vptr_FieldGenerator[8])(pFVar4,fwd_decls);
      lVar6 = lVar6 + 1;
      pDVar3 = this->descriptor_;
      lVar5 = lVar5 + 0x48;
      in_RDX = extraout_RDX;
    } while (lVar6 < *(int *)(pDVar3 + 4));
  }
  puVar1 = (this->extension_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar7 = (this->extension_generators_).
                super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar1; puVar7 = puVar7 + 1) {
    ExtensionGenerator::DetermineObjectiveCClassDefinitions
              ((puVar7->_M_t).
               super___uniq_ptr_impl<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
               .
               super__Head_base<0UL,_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_false>
               ._M_head_impl,fwd_decls);
    in_RDX = extraout_RDX_00;
  }
  puVar2 = (this->nested_message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (this->nested_message_generators_).
                super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1) {
    DetermineObjectiveCClassDefinitions
              ((puVar8->_M_t).
               super___uniq_ptr_impl<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
               .
               super__Head_base<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_false>
               ._M_head_impl,fwd_decls);
    in_RDX = extraout_RDX_01;
  }
  if (*(objectivec **)(this->descriptor_ + 0x18) != (objectivec *)0x0) {
    ClassName_abi_cxx11_(&local_48,*(objectivec **)(this->descriptor_ + 0x18),in_RDX);
    ObjCClassDeclaration(&local_68,&local_48);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)fwd_decls,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void MessageGenerator::DetermineObjectiveCClassDefinitions(
    std::set<std::string>* fwd_decls) {
  if (!IsMapEntryMessage(descriptor_)) {
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* fieldDescriptor = descriptor_->field(i);
      field_generators_.get(fieldDescriptor)
          .DetermineObjectiveCClassDefinitions(fwd_decls);
    }
  }

  for (const auto& generator : extension_generators_) {
    generator->DetermineObjectiveCClassDefinitions(fwd_decls);
  }

  for (const auto& generator : nested_message_generators_) {
    generator->DetermineObjectiveCClassDefinitions(fwd_decls);
  }

  const Descriptor* containing_descriptor = descriptor_->containing_type();
  if (containing_descriptor != NULL) {
    std::string containing_class = ClassName(containing_descriptor);
    fwd_decls->insert(ObjCClassDeclaration(containing_class));
  }
}